

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_Brep::IsManifold(ON_Brep *this,bool *pbIsOriented,bool *pbHasBoundary)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  TYPE TVar6;
  uint uVar7;
  uint uVar8;
  ON_BrepFace *pOVar9;
  ON_BrepLoop *pOVar10;
  ON_BrepTrim *pOVar11;
  ON_BrepEdge *pOVar12;
  int *piVar13;
  ON_BrepLoop *pOVar14;
  ON_BrepFace *pOVar15;
  bool bVar16;
  bool bVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  char *sFormat;
  int iVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  
  lVar18 = (long)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                 m_count;
  bVar26 = 0 < lVar18;
  if (pbIsOriented != (bool *)0x0) {
    *pbIsOriented = bVar26;
  }
  if (pbHasBoundary != (bool *)0x0) {
    *pbHasBoundary = false;
  }
  iVar2 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count;
  iVar3 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count;
  iVar4 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
  lVar28 = 0;
  bVar16 = false;
  bVar20 = bVar26;
  bVar17 = bVar26;
  do {
    if ((lVar18 <= lVar28) || (!bVar17)) {
      if (pbIsOriented != (bool *)0x0) {
        *pbIsOriented = (bool)(bVar26 & bVar20);
      }
      if (pbHasBoundary != (bool *)0x0) {
        *pbHasBoundary = bVar16;
      }
      if (((bVar20 == false) || (bVar16)) && (this->m_is_solid != 3)) {
        this->m_is_solid = 3;
      }
      return bVar20;
    }
    pOVar9 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
    if (pOVar9[lVar28].m_face_index != -1) {
      lVar19 = (long)pOVar9[lVar28].m_li.m_count;
      bVar1 = bVar17;
      if (lVar19 < 1) {
        bVar1 = false;
      }
      if (pbHasBoundary != (bool *)0x0) {
        bVar1 = bVar17;
      }
      bVar20 = (bool)(0 < lVar19 & bVar20);
      lVar25 = 0;
      while ((bVar17 = bVar1, lVar25 < lVar19 && (bVar1))) {
        uVar5 = pOVar9[lVar28].m_li.m_a[lVar25];
        if ((int)uVar5 < 0 || iVar2 <= (int)uVar5) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                     ,0x1b8e,"","Bogus loop index in face.m_li[]");
        }
        else {
          pOVar10 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                    m_a;
          lVar27 = (long)pOVar10[uVar5].m_ti.m_count;
          if (lVar27 < 1) {
            bVar17 = false;
          }
          if (pbHasBoundary != (bool *)0x0) {
            bVar17 = bVar1;
          }
          bVar20 = (bool)(0 < lVar27 & bVar20);
          lVar29 = 0;
          while ((bVar1 = bVar17, lVar29 < lVar27 && (bVar17))) {
            iVar21 = pOVar10[uVar5].m_ti.m_a[lVar29];
            lVar22 = (long)iVar21;
            if ((lVar22 < 0) || (iVar4 <= iVar21)) {
              iVar21 = 0x1b9d;
              sFormat = "Bogus loop index in loop.m_ti[]";
LAB_0041be0a:
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                         ,iVar21,"",sFormat);
            }
            else {
              pOVar11 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                        super_ON_ClassArray<ON_BrepTrim>.m_a;
              TVar6 = pOVar11[lVar22].m_type;
              if (TVar6 - mated < 2) {
                lVar24 = (long)pOVar11[lVar22].m_ei;
                if ((lVar24 < 0) || (iVar3 <= pOVar11[lVar22].m_ei)) {
                  iVar21 = 0x1bf6;
                  sFormat = "Bogus trim.m_ei or trim.m_type value";
                }
                else {
                  pOVar12 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                            super_ON_ClassArray<ON_BrepEdge>.m_a;
                  if (pOVar12[lVar24].m_ti.m_count != 2) {
                    bVar20 = false;
                    if (pbHasBoundary == (bool *)0x0) {
                      bVar17 = false;
                    }
                    goto LAB_0041be14;
                  }
                  piVar13 = pOVar12[lVar24].m_ti.m_a;
                  iVar23 = *piVar13;
                  if (iVar23 == iVar21) {
                    iVar23 = piVar13[1];
                  }
                  if (iVar23 == iVar21) goto LAB_0041be61;
                  uVar7 = pOVar11[lVar22].m_li;
                  if ((int)uVar7 < iVar2 && -1 < (int)uVar7) {
                    pOVar14 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                              super_ON_ClassArray<ON_BrepLoop>.m_a;
                    iVar21 = pOVar14[uVar7].m_fi;
                    if (((long)iVar21 < 0) ||
                       (uVar7 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                super_ON_ClassArray<ON_BrepFace>.m_count, (int)uVar7 <= iVar21)) {
                      iVar21 = 0x1bcc;
                      sFormat = "Bogus face index in m_L[trim.m_li]";
                    }
                    else {
                      uVar8 = pOVar11[iVar23].m_li;
                      if ((int)uVar8 < 0 || iVar2 <= (int)uVar8) {
                        iVar21 = 0x1be5;
                        sFormat = "Bogus loop index in other_trim.m_li";
                      }
                      else {
                        uVar8 = pOVar14[uVar8].m_fi;
                        if (uVar8 < uVar7 && -1 < (int)uVar8) {
                          pOVar15 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                    super_ON_ClassArray<ON_BrepFace>.m_a;
                          bVar1 = pOVar15[uVar8].m_bRev;
                          if (pOVar11[lVar22].m_bRev3d == pOVar15[iVar21].m_bRev) {
                            if (pOVar11[iVar23].m_bRev3d == bVar1) {
                              bVar26 = false;
                            }
                          }
                          else if (pOVar11[iVar23].m_bRev3d != bVar1) {
                            bVar26 = false;
                          }
                          goto LAB_0041be14;
                        }
                        iVar21 = 0x1bdf;
                        sFormat = "Bogus face index in m_L[other_trim.m_li]";
                      }
                    }
                  }
                  else {
                    iVar21 = 0x1bd2;
                    sFormat = "Bogus loop index in trim.m_li";
                  }
                }
                goto LAB_0041be0a;
              }
              if (TVar6 != singular) {
                if (TVar6 == boundary) {
                  bVar16 = true;
                }
                else {
LAB_0041be61:
                  bVar20 = false;
                  if (pbHasBoundary == (bool *)0x0) {
                    bVar17 = false;
                  }
                }
              }
            }
LAB_0041be14:
            lVar29 = lVar29 + 1;
          }
        }
        lVar25 = lVar25 + 1;
      }
    }
    lVar28 = lVar28 + 1;
  } while( true );
}

Assistant:

bool
ON_Brep::IsManifold( bool* pbIsOriented, bool* pbHasBoundary ) const
{
  const int fcnt = m_F.Count();
  bool bIsManifold = (fcnt > 0) ? true : false;
  bool bIsOriented = bIsManifold;
  bool bHasBoundary = false;
  int fi, other_ti, lcnt, tcnt, fli, lti;
  if ( pbIsOriented )
    *pbIsOriented = bIsOriented;
  if ( pbHasBoundary )
    *pbHasBoundary = bHasBoundary;
  const int brep_loop_count = m_L.Count();
  const int brep_trim_count = m_T.Count();
  const int brep_edge_count = m_E.Count();

  bool bKeepGoing = bIsManifold;

  for ( fi = 0; fi < fcnt && bKeepGoing; fi++ ) 
  {
    const ON_BrepFace& face = m_F[fi];
    if ( -1 == face.m_face_index )
    {
      // 28 October 2010 - Dale Lear and Chuck
      //    Do not test deleted faces. The join
      //    command calls is manifold with some
      //    deleted faces to avoid calling Compact
      //    lots of times during a join.
      continue;
    }

    lcnt = face.m_li.Count();
    if ( lcnt < 1 ) {
      bIsManifold = false;
      if (!pbHasBoundary)
        bKeepGoing = false;
    }

    for ( fli = 0; fli < lcnt && bKeepGoing; fli++ ) 
    {
      const int li = face.m_li[fli];
      if ( li < 0 || li >= brep_loop_count )
      {
        ON_ERROR("Bogus loop index in face.m_li[]");
        continue;
      }
      const ON_BrepLoop& loop = m_L[li];
      tcnt = loop.m_ti.Count();
      if (tcnt < 1 ) {
        bIsManifold = false;
        if (!pbHasBoundary)
          bKeepGoing = false;
      }
      for ( lti = 0; lti < tcnt && bKeepGoing; lti++ ) 
      {
        const int ti = loop.m_ti[lti];
        if ( ti < 0 || ti >= brep_trim_count )
        {
          ON_ERROR("Bogus loop index in loop.m_ti[]");
          continue;
        }
        const ON_BrepTrim& trim = m_T[ti];
        switch ( trim.m_type ) 
        {
        case ON_BrepTrim::boundary:
          bHasBoundary = true;
          break;
        case ON_BrepTrim::mated:
        case ON_BrepTrim::seam:
          // make sure we have a manifold join
          if ( trim.m_ei >= 0 && trim.m_ei < brep_edge_count )
          {
            const ON_BrepEdge& edge = m_E[trim.m_ei];
            if ( edge.m_ti.Count() != 2 ) {
              bIsManifold = false;
              if (!pbHasBoundary)
                bKeepGoing = false;
            }
            else 
            {
              other_ti = edge.m_ti[0];
              if ( other_ti == ti )
                other_ti = edge.m_ti[1];
              if ( other_ti == ti )
              {
                bIsManifold = false;
                if (!pbHasBoundary)
                  bKeepGoing = false;
              }
              else 
              {
                const ON_BrepTrim& other_trim = m_T[other_ti];

                // Nov 9, 2011 Tim - Fix for crash bug RR 93743
                // Better index checking.

                bool bFlipTrim = trim.m_bRev3d;
                if (0 <= trim.m_li && brep_loop_count > trim.m_li)
                {
                  if (m_L[trim.m_li].m_fi >= 0 && m_L[trim.m_li].m_fi < m_F.Count()){
                    if ( m_F[m_L[trim.m_li].m_fi].m_bRev )
                      bFlipTrim = !bFlipTrim;
                  }
                  else
                  {
                    ON_ERROR("Bogus face index in m_L[trim.m_li]");
                    continue;
                  }
                }
                else
                {
                  ON_ERROR("Bogus loop index in trim.m_li");
                  continue;
                }

                bool bFlipOther = other_trim.m_bRev3d;
                if (0 <= other_trim.m_li && brep_loop_count > other_trim.m_li)
                {
                  if (m_L[other_trim.m_li].m_fi >= 0 && m_L[other_trim.m_li].m_fi < m_F.Count()){
                    if ( m_F[m_L[other_trim.m_li].m_fi].m_bRev )
                      bFlipOther = !bFlipOther;
                  }
                  else
                  {
                    ON_ERROR("Bogus face index in m_L[other_trim.m_li]");
                    continue;
                  }
                }
                else
                {
                  ON_ERROR("Bogus loop index in other_trim.m_li");
                  continue;
                }

                if ( bFlipTrim && bFlipOther )
                {
                  bIsOriented = false;
                }
                else if ( !bFlipTrim && !bFlipOther )
                {
                  bIsOriented = false;
                }
              }
            }
          }
          else
          {
            ON_ERROR("Bogus trim.m_ei or trim.m_type value");
          }
          break;
        case ON_BrepTrim::singular:
          // nothing to check here
          break;
        default:
          bIsManifold = false;
          if (!pbHasBoundary)
            bKeepGoing = false;

          break;
        }
      }
    }
  }
  if ( !bIsManifold ) {
    bIsOriented = false;
    //21 June 2017 - Chuck - bHasBoundary just says if there are any naked edges.
    //Even if the brep is non-manifold, this should still be the case.
    //bHasBoundary = false;
  }
  if ( pbIsOriented )
    *pbIsOriented = bIsOriented;
  if ( pbHasBoundary )
    *pbHasBoundary = bHasBoundary;
  if ( !bIsManifold || bHasBoundary )
  {
    if ( m_is_solid != 3 )
    {
      // lazy evaluation used on m_is_solid
      const_cast<ON_Brep*>(this)->m_is_solid = 3;
    }
  }

  return bIsManifold;
}